

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O0

uint32 rw::xbox::makeVertexFmt(int32 flags,uint32 numTexSets)

{
  undefined4 local_18;
  undefined4 local_14;
  uint32 i;
  uint32 fmt;
  uint32 numTexSets_local;
  int32 flags_local;
  
  i = numTexSets;
  if (4 < numTexSets) {
    i = 4;
  }
  local_14 = 5;
  if ((flags & 0x10U) != 0) {
    local_14 = 0x45;
  }
  for (local_18 = 0; local_18 < i; local_18 = local_18 + 1) {
    local_14 = 0x500 << ((byte)(local_18 << 2) & 0x1f) | local_14;
  }
  if ((flags & 8U) != 0) {
    local_14 = local_14 | 0x1000000;
  }
  return local_14;
}

Assistant:

uint32
makeVertexFmt(int32 flags, uint32 numTexSets)
{
	if(numTexSets > 4)
		numTexSets = 4;
	uint32 fmt = 0x5;	// FLOAT3
	if(flags & Geometry::NORMALS)
		fmt |= 0x40;	// NORMPACKED3
	for(uint32 i = 0; i < numTexSets; i++)
		fmt |= 0x500 << i*4;	// FLOAT2
	if(flags & Geometry::PRELIT)
		fmt |= 0x1000000;	// D3DCOLOR
	return fmt;
}